

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Abstract.h
# Opt level: O1

ostream * covenant::operator<<(ostream *o,AbstractMethod abs)

{
  string *psVar1;
  long lVar2;
  char *pcVar3;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (abs == CYCLE_BREAKING) {
    pcVar3 = "cycle-breaking";
    lVar2 = 0xe;
  }
  else {
    if (abs != SIGMA_STAR) {
      psVar1 = (string *)__cxa_allocate_exception(0x20);
      local_40 = local_30;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,"invalid abstraction method","");
      *(string **)psVar1 = psVar1 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar1,local_40,local_40 + local_38);
      __cxa_throw(psVar1,&error::typeinfo,error::~error);
    }
    pcVar3 = "sigma-star";
    lVar2 = 10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(o,pcVar3,lVar2);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, AbstractMethod abs)
{
    if (abs == SIGMA_STAR)
      o << "sigma-star";
    else if (abs == CYCLE_BREAKING)
      o << "cycle-breaking";
    else throw error("invalid abstraction method");
    return o;
}